

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_maybe_deferred_bind(uv_udp_t *handle,int domain,uint flags)

{
  sockaddr_in6 *addr_1;
  sockaddr_in *addr;
  undefined1 local_48 [4];
  socklen_t addrlen;
  uchar taddr [28];
  uint flags_local;
  int domain_local;
  uv_udp_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    if (domain == 2) {
      memset(local_48,0,0x10);
      local_48._0_2_ = 2;
      addrlen = 0;
      addr._4_4_ = 0x10;
    }
    else {
      if (domain != 10) {
        __assert_fail("0 && \"unsupported address family\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                      ,0x17a,"int uv__udp_maybe_deferred_bind(uv_udp_t *, int, unsigned int)");
      }
      memset(local_48,0,0x1c);
      local_48._0_2_ = 10;
      taddr[0] = in6addr_any;
      taddr[1] = in6addr_any_1;
      taddr[2] = uRam00000000001b8102;
      taddr[3] = uRam00000000001b8103;
      taddr[4] = uRam00000000001b8104;
      taddr[5] = uRam00000000001b8105;
      taddr[6] = uRam00000000001b8106;
      taddr[7] = uRam00000000001b8107;
      taddr[8] = (uchar)isatty;
      taddr[9] = isatty_1;
      taddr[10] = uRam00000000001b810a;
      taddr[0xb] = uRam00000000001b810b;
      taddr[0xc] = uRam00000000001b810c;
      taddr[0xd] = uRam00000000001b810d;
      taddr[0xe] = uRam00000000001b810e;
      taddr[0xf] = uRam00000000001b810f;
      addr._4_4_ = 0x1c;
    }
    handle_local._4_4_ = uv__udp_bind(handle,(sockaddr *)local_48,addr._4_4_,flags);
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_maybe_deferred_bind(uv_udp_t* handle,
                                       int domain,
                                       unsigned int flags) {
  union {
    struct sockaddr_in6 in6;
    struct sockaddr_in in;
    struct sockaddr addr;
  } taddr;
  socklen_t addrlen;

  if (handle->io_watcher.fd != -1)
    return 0;

  switch (domain) {
  case AF_INET:
  {
    struct sockaddr_in* addr = &taddr.in;
    memset(addr, 0, sizeof *addr);
    addr->sin_family = AF_INET;
    addr->sin_addr.s_addr = INADDR_ANY;
    addrlen = sizeof *addr;
    break;
  }
  case AF_INET6:
  {
    struct sockaddr_in6* addr = &taddr.in6;
    memset(addr, 0, sizeof *addr);
    addr->sin6_family = AF_INET6;
    addr->sin6_addr = in6addr_any;
    addrlen = sizeof *addr;
    break;
  }
  default:
    assert(0 && "unsupported address family");
    abort();
  }

  return uv__udp_bind(handle, &taddr.addr, addrlen, flags);
}